

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

void __thiscall ON_OBSOLETE_V5_DimLinear::ON_OBSOLETE_V5_DimLinear(ON_OBSOLETE_V5_DimLinear *this)

{
  ON_2dPointArray *this_00;
  long lVar1;
  ON_Plane *pOVar2;
  ON_Plane *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  ON_OBSOLETE_V5_Annotation::ON_OBSOLETE_V5_Annotation(&this->super_ON_OBSOLETE_V5_Annotation);
  (this->super_ON_OBSOLETE_V5_Annotation).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00822bb0;
  (this->super_ON_OBSOLETE_V5_Annotation).m_type = dtDimLinear;
  (this->super_ON_OBSOLETE_V5_Annotation).m_textdisplaymode = kAboveLine;
  pOVar2 = &ON_xy_plane;
  pOVar3 = &(this->super_ON_OBSOLETE_V5_Annotation).m_plane;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar3->origin).x = (pOVar2->origin).x;
    pOVar2 = (ON_Plane *)((long)pOVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  ON_OBSOLETE_V5_AnnotationText::SetText(&(this->super_ON_OBSOLETE_V5_Annotation).m_usertext,L"<>");
  ON_AnnotationTextFormula::Set(&this->super_ON_OBSOLETE_V5_Annotation,(wchar_t *)0x0);
  this_00 = &(this->super_ON_OBSOLETE_V5_Annotation).m_points;
  ON_SimpleArray<ON_2dPoint>::Reserve(&this_00->super_ON_SimpleArray<ON_2dPoint>,5);
  if (4 < (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.
          m_capacity) {
    (this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>.m_count = 5;
  }
  ON_SimpleArray<ON_2dPoint>::Zero(&this_00->super_ON_SimpleArray<ON_2dPoint>);
  return;
}

Assistant:

ON_OBSOLETE_V5_DimLinear::ON_OBSOLETE_V5_DimLinear()
{
  //ON_OBSOLETE_V5_DimExtra* pDE = new ON_OBSOLETE_V5_DimExtra;
  //if( pDE)
  //{
  //  if( !AttachUserData( pDE))
  //    delete pDE;
  //  else
  //    pDE->SetDefaults();
  //}

  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear;
  m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
  m_plane = ON_xy_plane;
  SetTextValue(DefaultText());
  SetTextFormula(0);
  m_points.Reserve(ON_OBSOLETE_V5_DimLinear::dim_pt_count);
  m_points.SetCount(ON_OBSOLETE_V5_DimLinear::dim_pt_count);
  m_points.Zero();
}